

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void CopyRow_AVX(uint8_t *src,uint8_t *dst,int width)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  
  do {
    uVar2 = *(undefined8 *)src;
    uVar3 = *(undefined8 *)(src + 8);
    uVar4 = *(undefined8 *)(src + 0x10);
    uVar5 = *(undefined8 *)(src + 0x18);
    uVar6 = *(undefined8 *)(src + 0x20);
    uVar7 = *(undefined8 *)(src + 0x28);
    uVar8 = *(undefined8 *)(src + 0x30);
    uVar9 = *(undefined8 *)(src + 0x38);
    src = src + 0x40;
    *(undefined8 *)dst = uVar2;
    *(undefined8 *)(dst + 8) = uVar3;
    *(undefined8 *)(dst + 0x10) = uVar4;
    *(undefined8 *)(dst + 0x18) = uVar5;
    *(undefined8 *)(dst + 0x20) = uVar6;
    *(undefined8 *)(dst + 0x28) = uVar7;
    *(undefined8 *)(dst + 0x30) = uVar8;
    *(undefined8 *)(dst + 0x38) = uVar9;
    dst = dst + 0x40;
    iVar10 = width + -0x40;
    bVar1 = 0x3f < width;
    width = iVar10;
  } while (iVar10 != 0 && bVar1);
  return;
}

Assistant:

void CopyRow_AVX(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "lea         0x40(%0),%0                   \n"
      "vmovdqu     %%ymm0,(%1)                   \n"
      "vmovdqu     %%ymm1,0x20(%1)               \n"
      "lea         0x40(%1),%1                   \n"
      "sub         $0x40,%2                      \n"
      "jg          1b                            \n"
      : "+r"(src),   // %0
        "+r"(dst),   // %1
        "+r"(width)  // %2
      :
      : "memory", "cc", "xmm0", "xmm1");
}